

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O0

void cilkg_publish_global_state(global_state_t *g)

{
  global_state_t *g_local;
  
  __cilkrts_global_state = g;
  LOCK();
  UNLOCK();
  cilkg_singleton_ptr = g;
  return;
}

Assistant:

void cilkg_publish_global_state(global_state_t* g) 
{
    // TBD: which one of these needs to be executed first?  I say
    // cilkg_singleton_ptr needs to be set last, with a mfence in
    // between, since it is the flag that cilkg_is_published_is
    // checking for.
    __cilkrts_global_state = g;
    __cilkrts_fence();
    cilkg_singleton_ptr = g;
}